

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::TestSpecParser::addPattern<Catch::TestSpec::NamePattern>(TestSpecParser *this)

{
  byte bVar1;
  value_type *pvVar2;
  ulong uVar3;
  vector<std::shared_ptr<Catch::TestSpec::Pattern>,_std::allocator<std::shared_ptr<Catch::TestSpec::Pattern>_>_>
  *in_RDI;
  PatternPtr pattern;
  size_t i;
  string token;
  undefined7 in_stack_fffffffffffffec8;
  undefined1 in_stack_fffffffffffffecf;
  allocator *this_00;
  value_type *__x;
  string *in_stack_fffffffffffffee8;
  string *in_stack_fffffffffffffef0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff08;
  string local_e8 [39];
  allocator local_c1;
  string local_c0 [32];
  string local_a0 [48];
  string local_70 [32];
  string local_50 [32];
  value_type *local_30;
  string local_28 [40];
  
  subString_abi_cxx11_
            ((TestSpecParser *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8));
  local_30 = (value_type *)0x0;
  while (__x = local_30,
        pvVar2 = (value_type *)
                 clara::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                            &in_RDI[2].
                             super__Vector_base<std::shared_ptr<Catch::TestSpec::Pattern>,_std::allocator<std::shared_ptr<Catch::TestSpec::Pattern>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish), __x < pvVar2) {
    clara::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               &in_RDI[2].
                super__Vector_base<std::shared_ptr<Catch::TestSpec::Pattern>,_std::allocator<std::shared_ptr<Catch::TestSpec::Pattern>_>_>
                ._M_impl.super__Vector_impl_data._M_finish,(size_type)local_30);
    std::__cxx11::string::substr((ulong)local_70,(ulong)local_28);
    clara::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               &in_RDI[2].
                super__Vector_base<std::shared_ptr<Catch::TestSpec::Pattern>,_std::allocator<std::shared_ptr<Catch::TestSpec::Pattern>_>_>
                ._M_impl.super__Vector_impl_data._M_finish,(size_type)local_30);
    std::__cxx11::string::substr((ulong)local_a0,(ulong)local_28);
    std::operator+(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
    std::__cxx11::string::operator=(local_28,local_50);
    std::__cxx11::string::~string(local_50);
    std::__cxx11::string::~string(local_a0);
    std::__cxx11::string::~string(local_70);
    local_30 = (value_type *)
               ((long)&(local_30->
                       super___shared_ptr<Catch::TestSpec::Pattern,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr + 1);
  }
  clara::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::clear
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x153c97);
  this_00 = &local_c1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c0,"exclude:",this_00);
  bVar1 = startsWith(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  if ((bVar1 & 1) != 0) {
    *(undefined1 *)
     ((long)&(in_RDI->
             super__Vector_base<std::shared_ptr<Catch::TestSpec::Pattern>,_std::allocator<std::shared_ptr<Catch::TestSpec::Pattern>_>_>
             )._M_impl.super__Vector_impl_data._M_start + 4) = 1;
    std::__cxx11::string::substr((ulong)local_e8,(ulong)local_28);
    std::__cxx11::string::operator=(local_28,local_e8);
    std::__cxx11::string::~string(local_e8);
  }
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    std::make_shared<Catch::TestSpec::NamePattern,std::__cxx11::string&>(in_stack_fffffffffffffef8);
    std::shared_ptr<Catch::TestSpec::Pattern>::shared_ptr<Catch::TestSpec::NamePattern,void>
              ((shared_ptr<Catch::TestSpec::Pattern> *)this_00,
               (shared_ptr<Catch::TestSpec::NamePattern> *)CONCAT17(bVar1,in_stack_fffffffffffffec8)
              );
    clara::std::shared_ptr<Catch::TestSpec::NamePattern>::~shared_ptr
              ((shared_ptr<Catch::TestSpec::NamePattern> *)0x153dc3);
    if (((ulong)(in_RDI->
                super__Vector_base<std::shared_ptr<Catch::TestSpec::Pattern>,_std::allocator<std::shared_ptr<Catch::TestSpec::Pattern>_>_>
                )._M_impl.super__Vector_impl_data._M_start & 0x100000000) != 0) {
      std::make_shared<Catch::TestSpec::ExcludedPattern,std::shared_ptr<Catch::TestSpec::Pattern>&>
                ((shared_ptr<Catch::TestSpec::Pattern> *)in_stack_fffffffffffffef8);
      std::shared_ptr<Catch::TestSpec::Pattern>::operator=
                ((shared_ptr<Catch::TestSpec::Pattern> *)this_00,
                 (shared_ptr<Catch::TestSpec::ExcludedPattern> *)
                 CONCAT17(bVar1,in_stack_fffffffffffffec8));
      clara::std::shared_ptr<Catch::TestSpec::ExcludedPattern>::~shared_ptr
                ((shared_ptr<Catch::TestSpec::ExcludedPattern> *)0x153df8);
    }
    clara::std::
    vector<std::shared_ptr<Catch::TestSpec::Pattern>,_std::allocator<std::shared_ptr<Catch::TestSpec::Pattern>_>_>
    ::push_back(in_RDI,__x);
    clara::std::shared_ptr<Catch::TestSpec::Pattern>::~shared_ptr
              ((shared_ptr<Catch::TestSpec::Pattern> *)0x153e39);
  }
  *(undefined1 *)
   ((long)&(in_RDI->
           super__Vector_base<std::shared_ptr<Catch::TestSpec::Pattern>,_std::allocator<std::shared_ptr<Catch::TestSpec::Pattern>_>_>
           )._M_impl.super__Vector_impl_data._M_start + 4) = 0;
  *(undefined4 *)
   &(in_RDI->
    super__Vector_base<std::shared_ptr<Catch::TestSpec::Pattern>,_std::allocator<std::shared_ptr<Catch::TestSpec::Pattern>_>_>
    )._M_impl.super__Vector_impl_data._M_start = 0;
  std::__cxx11::string::~string(local_28);
  return;
}

Assistant:

void addPattern() {
            std::string token = subString();
            for( std::size_t i = 0; i < m_escapeChars.size(); ++i )
                token = token.substr( 0, m_escapeChars[i]-m_start-i ) + token.substr( m_escapeChars[i]-m_start-i+1 );
            m_escapeChars.clear();
            if( startsWith( token, "exclude:" ) ) {
                m_exclusion = true;
                token = token.substr( 8 );
            }
            if( !token.empty() ) {
                TestSpec::PatternPtr pattern = std::make_shared<T>( token );
                if( m_exclusion )
                    pattern = std::make_shared<TestSpec::ExcludedPattern>( pattern );
                m_currentFilter.m_patterns.push_back( pattern );
            }
            m_exclusion = false;
            m_mode = None;
        }